

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O0

bool __thiscall EMWINHandler::extractTimeStamp(EMWINHandler *this,string *text,timespec *ts)

{
  size_type sVar1;
  char *__s;
  char *pcVar2;
  time_t tVar3;
  time_t *in_RDX;
  string *in_RSI;
  char *ptr;
  tm tm;
  char *format;
  char *buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  char in_stack_00000117;
  string *in_stack_00000118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  time_t *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  std::__cxx11::string::string(local_58,in_RSI);
  util::split(in_stack_00000118,in_stack_00000117);
  std::__cxx11::string::~string(local_58);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_38);
  if (sVar1 < 5) {
    local_1 = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_38,4);
    __s = (char *)std::__cxx11::string::c_str();
    pcVar2 = strptime(__s,"%Y%m%d%H%M%S",(tm *)&stack0xffffffffffffff50);
    if (pcVar2 == __s + 0xe) {
      tVar3 = mktime((tm *)&stack0xffffffffffffff50);
      *local_20 = tVar3;
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff50);
  return (bool)(local_1 & 1);
}

Assistant:

bool EMWINHandler::extractTimeStamp(
    const std::string& text,
    struct timespec& ts) const {
  auto parts = split(text, '_');
  if (parts.size() < 5) {
    return false;
  }

  const char* buf = parts[4].c_str();
  const char* format = "%Y%m%d%H%M%S";
  struct tm tm;
  auto ptr = strptime(buf, format, &tm);

  // Only use time if strptime was successful
  if (ptr != (buf + 14)) {
    return false;
  }

  ts.tv_sec = mktime(&tm);
  return true;
}